

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

void rtr_change_socket_state(rtr_socket *rtr_socket,rtr_socket_state new_state)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket->state != RTR_SHUTDOWN && rtr_socket->state != new_state) {
    rtr_socket->state = new_state;
    if (new_state == RTR_SHUTDOWN) {
      lrtr_dbg("RTR_MGR: Calling rtr_mgr_cb with RTR_SHUTDOWN");
    }
    if (rtr_socket->connection_state_fp != (rtr_connection_state_fp)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        (*rtr_socket->connection_state_fp)
                  (rtr_socket,new_state,rtr_socket->connection_state_fp_param_config,
                   rtr_socket->connection_state_fp_param_group);
        return;
      }
      goto LAB_00109235;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00109235:
  __stack_chk_fail();
}

Assistant:

void rtr_change_socket_state(struct rtr_socket *rtr_socket, const enum rtr_socket_state new_state)
{
	if (rtr_socket->state == new_state)
		return;

	// RTR_SHUTDOWN state is final,struct rtr_socket will be shutdowned can't be switched to any other state
	if (rtr_socket->state == RTR_SHUTDOWN)
		return;

	rtr_socket->state = new_state;
	if (new_state == RTR_SHUTDOWN)
		MGR_DBG1("Calling rtr_mgr_cb with RTR_SHUTDOWN");

	if (rtr_socket->connection_state_fp)
		rtr_socket->connection_state_fp(rtr_socket, new_state, rtr_socket->connection_state_fp_param_config,
						rtr_socket->connection_state_fp_param_group);
}